

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.hpp
# Opt level: O0

void __thiscall front::symbol::FunctionSymbol::~FunctionSymbol(FunctionSymbol *this)

{
  FunctionSymbol *in_RDI;
  
  ~FunctionSymbol(in_RDI);
  operator_delete(in_RDI,0x50);
  return;
}

Assistant:

virtual ~FunctionSymbol() {}